

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O1

void __thiscall muduo::Thread::start(Thread *this)

{
  int iVar1;
  _Any_data *this_00;
  void *__stat_loc;
  SourceFile file;
  _Any_data local_1010;
  code *local_1000;
  Logger local_ff0;
  
  this->started_ = true;
  this_00 = (_Any_data *)operator_new(0x50);
  std::function<void_()>::function((function<void_()> *)&local_1010,&this->func_);
  detail::ThreadData::ThreadData
            ((ThreadData *)this_00,(ThreadFunc *)&local_1010,&this->name_,&this->tid_,&this->latch_)
  ;
  if (local_1000 != (code *)0x0) {
    (*local_1000)(&local_1010,&local_1010,__destroy_functor);
  }
  __stat_loc = (void *)0x0;
  iVar1 = pthread_create(&this->pthreadId_,(pthread_attr_t *)0x0,detail::startThread,this_00);
  if (iVar1 == 0) {
    CountDownLatch::wait(&this->latch_,__stat_loc);
  }
  else {
    this->started_ = false;
    if (*(char **)(this_00->_M_pod_data + 0x20) != this_00->_M_pod_data + 0x30) {
      operator_delete(*(char **)(this_00->_M_pod_data + 0x20));
    }
    if (*(code **)(this_00 + 1) != (code *)0x0) {
      (**(code **)(this_00 + 1))(this_00,this_00,__destroy_functor);
    }
    operator_delete(this_00);
    file._8_8_ = 9;
    file.data_ = "Thread.cc";
    Logger::Logger(&local_ff0,file,0xb7,true);
    if (0x18 < (uint)(((int)&local_ff0 + 0xfb8) - (int)local_ff0.impl_.stream_.buffer_.cur_)) {
      builtin_strncpy(local_ff0.impl_.stream_.buffer_.cur_,"Failed in pthread_create",0x18);
      local_ff0.impl_.stream_.buffer_.cur_ = local_ff0.impl_.stream_.buffer_.cur_ + 0x18;
    }
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void Thread::start()
{
  assert(!started_);
  started_ = true;
  // FIXME: move(func_)
  detail::ThreadData* data = new detail::ThreadData(func_, name_, &tid_, &latch_);
  if (pthread_create(&pthreadId_, NULL, &detail::startThread, data))
  {
    started_ = false;
    delete data; // or no delete?
    LOG_SYSFATAL << "Failed in pthread_create";
  }
  else
  {
    latch_.wait();
    assert(tid_ > 0);
  }
}